

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O1

void Map_TimeComputeRequiredGlobal(Map_Man_t *p)

{
  long lVar1;
  int iVar2;
  Map_Node_t **ppMVar3;
  Map_Node_t *pMVar4;
  Map_Time_t *pMVar5;
  bool bVar6;
  Scl_Con_t *pSVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  
  bVar13 = false;
  iVar11 = 0;
  pSVar7 = Scl_ConReadMan();
  if (pSVar7 != (Scl_Con_t *)0x0) {
    pSVar7 = Scl_ConReadMan();
    iVar2 = (pSVar7->vOutReqs).nSize;
    if (0 < (long)iVar2) {
      lVar9 = 0;
      iVar11 = 0;
      do {
        iVar11 = iVar11 + (uint)((pSVar7->vOutReqs).pArray[lVar9] == 0);
        lVar9 = lVar9 + 1;
      } while (iVar2 != lVar9);
    }
    bVar13 = iVar11 != iVar2;
  }
  fVar14 = Map_TimeComputeArrivalMax(p);
  p->fRequiredGlo = fVar14;
  fVar15 = p->DelayTarget;
  if ((fVar15 != -1.0) || (NAN(fVar15))) {
    if (fVar14 <= fVar15 + p->fEpsilon) {
      if (fVar14 < fVar15 - p->fEpsilon) {
        if ((p->fMappingMode == 1) && (p->fVerbose != 0)) {
          printf("Relaxing the required times from (%4.2f) to the target (%4.2f).\n",
                 SUB84((double)fVar14,0),(double)fVar15);
        }
        p->fRequiredGlo = p->DelayTarget;
      }
    }
    else if (p->fMappingMode == 1) {
      printf("Cannot meet the target required times (%4.2f). Continue anyway.\n",
             SUB84((double)fVar15,0));
    }
  }
  lVar9 = (long)p->vMapObjs->nSize;
  if (0 < lVar9) {
    ppMVar3 = p->vMapObjs->pArray;
    lVar10 = 0;
    do {
      pMVar4 = ppMVar3[lVar10];
      pMVar4->tRequired[0].Rise = 3.4028235e+37;
      pMVar4->tRequired[0].Fall = 3.4028235e+37;
      *(undefined8 *)&pMVar4->tRequired[0].Worst = 0x7dcccccc7dcccccc;
      pMVar4->tRequired[1].Fall = 3.4028235e+37;
      pMVar4->tRequired[1].Worst = 3.4028235e+37;
      lVar10 = lVar10 + 1;
    } while (lVar9 != lVar10);
  }
  if (0 < p->nOutputs) {
    lVar9 = 2;
    lVar10 = 0;
    do {
      uVar8 = (ulong)(~(uint)p->pOutputs[lVar10] & 1);
      uVar12 = (ulong)p->pOutputs[lVar10] & 0xfffffffffffffffe;
      lVar1 = uVar12 + uVar8 * 0xc;
      if (bVar13) {
        pSVar7 = Scl_ConReadMan();
        if ((pSVar7->vOutReqs).nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        fVar15 = (float)(pSVar7->vOutReqs).pArray[lVar10] / 1000.0;
        if (fVar15 <= 0.0) goto LAB_004019db;
        fVar14 = *(float *)(lVar1 + 0x68);
        if (fVar15 < fVar14) {
LAB_004019d6:
          bVar6 = fVar14 <= fVar15;
          fVar15 = fVar14;
          if (bVar6) goto LAB_004019db;
        }
      }
      else {
        pMVar5 = p->pOutputRequireds;
        if (pMVar5 != (Map_Time_t *)0x0) {
          fVar15 = (&pMVar5->Rise)[lVar9];
          if ((0.0 < fVar15) && (*(float *)(lVar1 + 0x68) <= fVar15)) goto LAB_004019e0;
          if ((pMVar5 != (Map_Time_t *)0x0) && (fVar15 = (&pMVar5->Rise)[lVar9], 0.0 < fVar15)) {
            fVar14 = *(float *)(lVar1 + 0x68);
            goto LAB_004019d6;
          }
        }
LAB_004019db:
        fVar15 = p->fRequiredGlo;
      }
LAB_004019e0:
      lVar1 = uVar12 + uVar8 * 0xc;
      *(float *)(lVar1 + 0x80) = fVar15;
      *(float *)(lVar1 + 0x7c) = fVar15;
      *(float *)(lVar1 + 0x78) = fVar15;
      lVar10 = lVar10 + 1;
      lVar9 = lVar9 + 3;
    } while (lVar10 < p->nOutputs);
  }
  Map_TimePropagateRequired(p);
  return;
}

Assistant:

void Map_TimeComputeRequiredGlobal( Map_Man_t * p )
{
    int fUseConMan = Scl_ConIsRunning() && Scl_ConHasOutReqs();
    Map_Time_t * ptTime, * ptTimeA;
    int fPhase, i; 
    // update the required times according to the target
    p->fRequiredGlo = Map_TimeComputeArrivalMax( p );
    if ( p->DelayTarget != -1 )
    {
        if ( p->fRequiredGlo > p->DelayTarget + p->fEpsilon )
        {
            if ( p->fMappingMode == 1 )
                printf( "Cannot meet the target required times (%4.2f). Continue anyway.\n", p->DelayTarget );
        }
        else if ( p->fRequiredGlo < p->DelayTarget - p->fEpsilon )
        {
            if ( p->fMappingMode == 1 && p->fVerbose )
                printf( "Relaxing the required times from (%4.2f) to the target (%4.2f).\n", p->fRequiredGlo, p->DelayTarget );
            p->fRequiredGlo = p->DelayTarget;
        }
    }
    // clean the required times
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        p->vMapObjs->pArray[i]->tRequired[0].Rise  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[0].Fall  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[0].Worst = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Rise  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Fall  = MAP_FLOAT_LARGE;
        p->vMapObjs->pArray[i]->tRequired[1].Worst = MAP_FLOAT_LARGE;
    }
    // set the required times for the POs
    for ( i = 0; i < p->nOutputs; i++ )
    {
        fPhase  = !Map_IsComplement(p->pOutputs[i]);
        ptTime  =  Map_Regular(p->pOutputs[i])->tRequired + fPhase;
        ptTimeA =  Map_Regular(p->pOutputs[i])->tArrival + fPhase;

        if ( fUseConMan )
        {
            float Value = Scl_ConGetOutReqFloat(i);
            // if external required time can be achieved, use it
            if ( Value > 0 && ptTimeA->Worst <= Value )//&& Value <= p->fRequiredGlo )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = Value;
            // if external required cannot be achieved, set the earliest possible arrival time
            else if ( Value > 0 && ptTimeA->Worst > Value )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = ptTimeA->Worst;
            // otherwise, set the global required time
            else
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->fRequiredGlo;
        }
        else
        {
            // if external required time can be achieved, use it
            if ( p->pOutputRequireds && p->pOutputRequireds[i].Worst > 0 && ptTimeA->Worst <= p->pOutputRequireds[i].Worst )//&& p->pOutputRequireds[i].Worst <= p->fRequiredGlo )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->pOutputRequireds[i].Worst;
            // if external required cannot be achieved, set the earliest possible arrival time
            else if ( p->pOutputRequireds && p->pOutputRequireds[i].Worst > 0 && ptTimeA->Worst > p->pOutputRequireds[i].Worst )
                ptTime->Rise = ptTime->Fall = ptTime->Worst = ptTimeA->Worst;
            // otherwise, set the global required time
            else
                ptTime->Rise = ptTime->Fall = ptTime->Worst = p->fRequiredGlo;
        }
    }
    // visit nodes in the reverse topological order
    Map_TimePropagateRequired( p );
}